

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O1

void mergesort_3way_parallel(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uchar **ppuVar4;
  uchar **ppuVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  ulong n_00;
  ulong uVar9;
  
  if (0x1f < n) {
    n_00 = n / 3;
    uVar9 = (n * 2) / 3;
    mergesort_3way_parallel(strings,n_00,tmp);
    mergesort_3way_parallel(strings + n_00,uVar9 - n_00,tmp + n_00);
    mergesort_3way_parallel(strings + uVar9,n - uVar9,tmp + uVar9);
    merge_3way(strings,n_00,strings + n_00,uVar9 - n_00,strings + uVar9,n - uVar9,tmp);
    memcpy(strings,tmp,n << 3);
    return;
  }
  ppuVar4 = strings;
  if (1 < (long)n) {
    do {
      iVar3 = (int)n;
      n = (size_t)(iVar3 - 1);
      pbVar1 = ppuVar4[1];
      for (ppuVar5 = ppuVar4 + 1; strings < ppuVar5; ppuVar5 = ppuVar5 + -1) {
        pbVar2 = ppuVar5[-1];
        bVar6 = *pbVar2;
        bVar7 = *pbVar1;
        if (bVar6 != 0 && bVar6 == bVar7) {
          lVar8 = 1;
          do {
            bVar6 = pbVar2[lVar8];
            bVar7 = pbVar1[lVar8];
            if (bVar6 == 0) break;
            lVar8 = lVar8 + 1;
          } while (bVar6 == bVar7);
        }
        if (bVar6 <= bVar7) break;
        *ppuVar5 = pbVar2;
      }
      *ppuVar5 = pbVar1;
      ppuVar4 = ppuVar4 + 1;
    } while (2 < iVar3);
  }
  return;
}

Assistant:

static void
mergesort_3way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/3, split1 = (2*n)/3;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_3way_parallel(strings,        split0,        tmp);
#pragma omp section
		mergesort_3way_parallel(strings+split0, split1-split0, tmp+split0);
#pragma omp section
		mergesort_3way_parallel(strings+split1, n-split1,      tmp+split1);
	}
	merge_3way(strings, split0,
	           strings+split0, split1-split0,
	           strings+split1, n-split1,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}